

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es32cContextFlagsTests.cpp
# Opt level: O0

void __thiscall es32cts::ContextFlagsCase::deinit(ContextFlagsCase *this)

{
  ContextFlagsCase *this_local;
  
  releaseContext(this);
  return;
}

Assistant:

void ContextFlagsCase::deinit(void)
{
	releaseContext();
}